

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::FinalizeTargetCompileInfo(cmGlobalGenerator *this)

{
  cmTarget *this_00;
  pointer ppcVar1;
  cmMakefile *this_01;
  PolicyStatus PVar2;
  char *value;
  uint uVar3;
  cmValueWithOrigin *entry;
  pointer s;
  __node_base *p_Var4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> noconfig_compile_definitions;
  string local_90;
  string defPropName;
  string local_50;
  
  uVar3 = 0;
  while( true ) {
    ppcVar1 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
        (ulong)uVar3) break;
    this_01 = ppcVar1[uVar3]->Makefile;
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::vector
              (&noconfig_compile_definitions,&this_01->CompileDefinitionsEntries);
    p_Var4 = &(this_01->Targets)._M_h._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      this_00 = (cmTarget *)(p_Var4 + 5);
      cmTarget::AppendBuildInterfaceIncludes(this_00);
      entry = noconfig_compile_definitions.
              super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
              super__Vector_impl_data._M_start;
      if (*(int *)&p_Var4[0x61]._M_nxt != 7) {
        for (; entry != noconfig_compile_definitions.
                        super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                        _M_impl.super__Vector_impl_data._M_finish; entry = entry + 1) {
          cmTarget::InsertCompileDefinition(this_00,entry);
        }
        PVar2 = cmMakefile::GetPolicyStatus(this_01,CMP0043);
        if (PVar2 < NEW) {
          configs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          configs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          configs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmMakefile::GetConfigurations(&local_50,this_01,&configs,true);
          std::__cxx11::string::~string((string *)&local_50);
          for (s = configs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              s != configs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
            std::__cxx11::string::string
                      ((string *)&defPropName,"COMPILE_DEFINITIONS_",(allocator *)&local_90);
            cmsys::SystemTools::UpperCase(&local_90,s);
            std::__cxx11::string::append((string *)&defPropName);
            std::__cxx11::string::~string((string *)&local_90);
            value = cmMakefile::GetProperty(this_01,&defPropName);
            cmTarget::AppendProperty(this_00,&defPropName,value,false);
            std::__cxx11::string::~string((string *)&defPropName);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&configs);
        }
      }
    }
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::~vector
              (&noconfig_compile_definitions);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void cmGlobalGenerator::FinalizeTargetCompileInfo()
{
  // Construct per-target generator information.
  for(unsigned int i=0; i < this->LocalGenerators.size(); ++i)
    {
    cmMakefile *mf = this->LocalGenerators[i]->GetMakefile();

    const std::vector<cmValueWithOrigin> noconfig_compile_definitions =
                                mf->GetCompileDefinitionsEntries();

    cmTargets& targets = mf->GetTargets();
    for(cmTargets::iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      cmTarget* t = &ti->second;

      t->AppendBuildInterfaceIncludes();

      if (t->GetType() == cmTarget::INTERFACE_LIBRARY)
        {
        continue;
        }

      for (std::vector<cmValueWithOrigin>::const_iterator it
                                      = noconfig_compile_definitions.begin();
          it != noconfig_compile_definitions.end(); ++it)
        {
        t->InsertCompileDefinition(*it);
        }

      cmPolicies::PolicyStatus polSt
                                  = mf->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD)
        {
        std::vector<std::string> configs;
        mf->GetConfigurations(configs);

        for(std::vector<std::string>::const_iterator ci = configs.begin();
            ci != configs.end(); ++ci)
          {
          std::string defPropName = "COMPILE_DEFINITIONS_";
          defPropName += cmSystemTools::UpperCase(*ci);
          t->AppendProperty(defPropName,
                            mf->GetProperty(defPropName));
          }
        }
      }
    }
}